

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O1

void load_bitmap(void)

{
  char cVar1;
  ushort uVar2;
  char *pcVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  undefined8 uVar6;
  Am_Object local_20;
  Am_Image_Array amulet_icon_image;
  Am_Image_Array local_10 [8];
  
  pcVar3 = (char *)Am_Merge_Pathname("images/amuletside.xbm");
  Am_Image_Array::Am_Image_Array(&amulet_icon_image,pcVar3);
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  cVar1 = Am_Image_Array::Valid();
  if (cVar1 != '\0') {
    Am_Image_Array::Am_Image_Array(local_10,(Am_Image_Array *)&Am_No_Image);
    Am_Style::Am_Style((Am_Style *)0x3f59999a,0x3f400000,0x3f733333,&local_20,0,1,0,0,
                       &Am_DEFAULT_DASH_LIST,2,0,0,local_10);
    Am_Style::operator=((Am_Style *)&Amulet_Dark_Purple,(Am_Style *)&local_20);
    Am_Style::~Am_Style((Am_Style *)&local_20);
    Am_Image_Array::~Am_Image_Array(local_10);
    Am_Object::Create((char *)&local_20);
    pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&amulet_icon_image);
    uVar2 = Am_Object::Set((ushort)&local_20,(Am_Wrapper *)0xb0,(ulong)pAVar4);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
    uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
    pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
    Am_Object::operator=(&amulet_icon,pAVar5);
    Am_Object::~Am_Object(&local_20);
    Am_Image_Array::~Am_Image_Array(&amulet_icon_image);
    return;
  }
  uVar6 = Am_Error("Amulet bitmap image not found");
  Am_Image_Array::~Am_Image_Array(&amulet_icon_image);
  _Unwind_Resume(uVar6);
}

Assistant:

void
load_bitmap()
{
  const char *filename = Am_Merge_Pathname(AMULET_BITMAP);
  Am_Image_Array amulet_icon_image(filename);
  delete[] filename;
  if (!amulet_icon_image.Valid())
    Am_Error("Amulet bitmap image not found");
  Amulet_Dark_Purple = Am_Style(0.85f, 0.75f, 0.95f);
  amulet_icon = Am_Bitmap.Create("Amulet_Icon")
                    .Set(Am_IMAGE, amulet_icon_image)
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_No_Style);
}